

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

void __thiscall
UnitTests::Assert::NotIn<int,std::vector<int,std::allocator<int>>&>
          (Assert *this,string *msg,int value,vector<int,_std::allocator<int>_> *container)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  allocator local_45;
  int local_44;
  string local_40;
  
  local_44 = value;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish,&local_44);
  if (_Var1._M_current ==
      (container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    return;
  }
  std::__cxx11::string::string((string *)&local_40,"Did not expect container to contain",&local_45);
  ContainmentError<int,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (this,msg,&local_40,local_44,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
}

Assistant:

void NotIn(const std::string& msg, Value value, Container&& container) const
        {
            if (std::find(begin(container), end(container), value) != end(container))
            {
                ContainmentError(msg, "Did not expect container to contain", value, begin(container), end(container));
            }
        }